

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeClearObject(sqlite3 *db,Vdbe *p)

{
  SubProgram *pSVar1;
  SubProgram *pNext;
  SubProgram *pSub;
  Vdbe *p_local;
  sqlite3 *db_local;
  
  releaseMemArray(p->aColName,(uint)p->nResColumn * 5);
  pNext = p->pProgram;
  while (pNext != (SubProgram *)0x0) {
    pSVar1 = pNext->pNext;
    vdbeFreeOpArray(db,pNext->aOp,pNext->nOp);
    sqlite3DbFree(db,pNext);
    pNext = pSVar1;
  }
  if (p->magic != 0x16bceaa5) {
    releaseMemArray(p->aVar,(int)p->nVar);
    sqlite3DbFree(db,p->pVList);
    sqlite3DbFree(db,p->pFree);
  }
  vdbeFreeOpArray(db,p->aOp,p->nOp);
  sqlite3DbFree(db,p->aColName);
  sqlite3DbFree(db,p->zSql);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeClearObject(sqlite3 *db, Vdbe *p){
  SubProgram *pSub, *pNext;
  assert( p->db==0 || p->db==db );
  releaseMemArray(p->aColName, p->nResColumn*COLNAME_N);
  for(pSub=p->pProgram; pSub; pSub=pNext){
    pNext = pSub->pNext;
    vdbeFreeOpArray(db, pSub->aOp, pSub->nOp);
    sqlite3DbFree(db, pSub);
  }
  if( p->magic!=VDBE_MAGIC_INIT ){
    releaseMemArray(p->aVar, p->nVar);
    sqlite3DbFree(db, p->pVList);
    sqlite3DbFree(db, p->pFree);
  }
  vdbeFreeOpArray(db, p->aOp, p->nOp);
  sqlite3DbFree(db, p->aColName);
  sqlite3DbFree(db, p->zSql);
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  {
    int i;
    for(i=0; i<p->nScan; i++){
      sqlite3DbFree(db, p->aScan[i].zName);
    }
    sqlite3DbFree(db, p->aScan);
  }
#endif
}